

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_id.c
# Opt level: O2

int mpt_message_buf2id(void *ptr,size_t len,uint64_t *iptr)

{
  ulong uVar1;
  uint8_t *buf;
  char *pcVar2;
  bool bVar3;
  
  if (len == 0) {
    if (iptr != (uint64_t *)0x0) {
      *iptr = 0;
    }
    return 0;
  }
  uVar1 = (ulong)(*ptr != '\0');
  bVar3 = len == 1;
  pcVar2 = (char *)((long)ptr + 1);
  do {
    if (!bVar3) {
      return (int)uVar1;
    }
    if (uVar1 == 0 && *pcVar2 == '\0') {
      uVar1 = 0;
    }
    else {
      if (7 < uVar1) {
        return -2;
      }
      uVar1 = uVar1 + 1;
    }
    pcVar2 = pcVar2 + 1;
    bVar3 = false;
  } while( true );
}

Assistant:

int mpt_message_buf2id(const void *ptr, size_t len, uint64_t *iptr)
{
	const uint8_t *buf = ptr;
	uint64_t id;
	size_t used;
	uint8_t val;
	
	if (!len) {
		if (iptr) *iptr = 0;
		return 0;
	}
	/* initial value setup */
	id = *buf++;
	used = id ? 1 : 0;
	
	/* add higher order ID parts */
	while (!--len) {
		val = *buf++;
		id *= 0x100;
		if ((val || used) && ++used > sizeof(id)) {
			return MPT_ERROR(BadValue);
		}
		id |= val;
	}
	return used;
}